

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DTDGrammar.hpp
# Opt level: O2

XMLNotationDecl * __thiscall
xercesc_4_0::DTDGrammar::getNotationDecl(DTDGrammar *this,XMLCh *notName)

{
  XMLNotationDecl *pXVar1;
  
  pXVar1 = NameIdPool<xercesc_4_0::XMLNotationDecl>::getByKey(this->fNotationDeclPool,notName);
  return pXVar1;
}

Assistant:

inline const XMLNotationDecl* DTDGrammar::getNotationDecl(const XMLCh* const notName) const
{
    return fNotationDeclPool->getByKey(notName);
}